

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::sax_parse_internal
          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,json_sax_t *sax)

{
  string_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  token_type tVar5;
  int iVar6;
  undefined1 uVar7;
  parse_error *this_00;
  bool bVar8;
  reference rVar9;
  string local_100;
  string local_e0;
  parse_error local_c0;
  vector<bool,_std::allocator<bool>_> states;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  psVar1 = &(this->m_lexer).token_buffer;
LAB_00123257:
  switch(this->last_token) {
  case literal_true:
    iVar6 = (*sax->_vptr_json_sax[1])(sax);
    cVar4 = (char)iVar6;
    break;
  case literal_false:
    iVar6 = (*sax->_vptr_json_sax[1])(sax,0);
    cVar4 = (char)iVar6;
    break;
  case literal_null:
    iVar6 = (**sax->_vptr_json_sax)(sax);
    cVar4 = (char)iVar6;
    break;
  case value_string:
    iVar6 = (*sax->_vptr_json_sax[5])(sax,psVar1);
    cVar4 = (char)iVar6;
    break;
  case value_unsigned:
    iVar6 = (*sax->_vptr_json_sax[3])(sax,(this->m_lexer).value_unsigned);
    cVar4 = (char)iVar6;
    break;
  case value_integer:
    iVar6 = (*sax->_vptr_json_sax[2])(sax,(this->m_lexer).value_integer);
    cVar4 = (char)iVar6;
    break;
  case value_float:
    if (0x7fefffffffffffff < (ulong)ABS((this->m_lexer).value_float)) {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)&local_c0,&this->m_lexer);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_70,&this->m_lexer);
      std::operator+(&local_50,"number overflow parsing \'",&local_70);
      std::operator+(&local_100,&local_50,"\'");
      out_of_range::create((out_of_range *)&local_e0,0x196,&local_100);
      iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_c0,&local_e0);
      uVar7 = (undefined1)iVar6;
      exception::~exception((exception *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_c0;
      goto LAB_00123680;
    }
    iVar6 = (*sax->_vptr_json_sax[4])(sax,psVar1);
    cVar4 = (char)iVar6;
    break;
  case begin_array:
    iVar6 = (*sax->_vptr_json_sax[9])(sax,0xffffffffffffffff);
    if ((char)iVar6 == '\0') goto LAB_00123565;
    tVar5 = get_token(this);
    if (tVar5 == end_array) {
      iVar6 = (*sax->_vptr_json_sax[10])(sax);
      cVar4 = (char)iVar6;
      break;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&states,true);
    goto LAB_00123257;
  case begin_object:
    iVar6 = (*sax->_vptr_json_sax[6])(sax,0xffffffffffffffff);
    if ((char)iVar6 == '\0') goto LAB_00123565;
    tVar5 = get_token(this);
    if (tVar5 == end_object) {
      iVar6 = (*sax->_vptr_json_sax[8])(sax);
      cVar4 = (char)iVar6;
      break;
    }
    if (this->last_token == value_string) {
      iVar6 = (*sax->_vptr_json_sax[7])(sax);
      if ((char)iVar6 == '\0') goto LAB_00123565;
      tVar5 = get_token(this);
      if (tVar5 == name_separator) goto code_r0x001234f8;
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_e0,&this->m_lexer);
      sVar3 = (this->m_lexer).chars_read;
      exception_message(&local_100,this,name_separator);
      parse_error::create(&local_c0,0x65,sVar3,&local_100);
      iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
      uVar7 = (undefined1)iVar6;
    }
    else {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_e0,&this->m_lexer);
      sVar3 = (this->m_lexer).chars_read;
      exception_message(&local_100,this,value_string);
      parse_error::create(&local_c0,0x65,sVar3,&local_100);
      iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
      uVar7 = (undefined1)iVar6;
    }
    goto LAB_00123665;
  default:
    sVar2 = (this->m_lexer).chars_read;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(&local_e0,&this->m_lexer);
    sVar3 = (this->m_lexer).chars_read;
    exception_message(&local_100,this,literal_or_value);
    parse_error::create(&local_c0,0x65,sVar3,&local_100);
    iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
    uVar7 = (undefined1)iVar6;
LAB_00123665:
    exception::~exception(&local_c0.super_exception);
    std::__cxx11::string::~string((string *)&local_100);
    this_00 = (parse_error *)&local_e0;
LAB_00123680:
    std::__cxx11::string::~string((string *)this_00);
LAB_00123685:
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&states.super__Bvector_base<std::allocator<bool>_>);
    return (bool)uVar7;
  case parse_error:
    sVar2 = (this->m_lexer).chars_read;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(&local_e0,&this->m_lexer);
    sVar3 = (this->m_lexer).chars_read;
    exception_message(&local_100,this,uninitialized);
    parse_error::create(&local_c0,0x65,sVar3,&local_100);
    iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
    uVar7 = (undefined1)iVar6;
    goto LAB_00123665;
  }
  if (cVar4 == '\0') {
LAB_00123565:
    uVar7 = 0;
    goto LAB_00123685;
  }
LAB_00123370:
  uVar7 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset == 0 &&
          states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p ==
          states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p;
  if ((bool)uVar7) goto LAB_00123685;
  rVar9 = std::vector<bool,_std::allocator<bool>_>::back(&states);
  if ((*rVar9._M_p & rVar9._M_mask) == 0) {
    tVar5 = get_token(this);
    if (tVar5 == value_separator) {
      tVar5 = get_token(this);
      if (tVar5 != value_string) {
        sVar2 = (this->m_lexer).chars_read;
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string(&local_e0,&this->m_lexer);
        sVar3 = (this->m_lexer).chars_read;
        exception_message(&local_100,this,value_string);
        parse_error::create(&local_c0,0x65,sVar3,&local_100);
        iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
        uVar7 = (undefined1)iVar6;
        goto LAB_00123665;
      }
      iVar6 = (*sax->_vptr_json_sax[7])(sax);
      if ((char)iVar6 == '\0') goto LAB_00123565;
      tVar5 = get_token(this);
      if (tVar5 != name_separator) {
        sVar2 = (this->m_lexer).chars_read;
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string(&local_e0,&this->m_lexer);
        sVar3 = (this->m_lexer).chars_read;
        exception_message(&local_100,this,name_separator);
        parse_error::create(&local_c0,0x65,sVar3,&local_100);
        iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
        uVar7 = (undefined1)iVar6;
        goto LAB_00123665;
      }
LAB_001234af:
      get_token(this);
      goto LAB_00123257;
    }
    if (this->last_token != end_object) {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_e0,&this->m_lexer);
      sVar3 = (this->m_lexer).chars_read;
      exception_message(&local_100,this,end_object);
      parse_error::create(&local_c0,0x65,sVar3,&local_100);
      iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
      uVar7 = (undefined1)iVar6;
      goto LAB_00123665;
    }
    iVar6 = (*sax->_vptr_json_sax[8])(sax);
    if ((char)iVar6 == '\0') goto LAB_00123685;
    if (states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
        .super__Bit_iterator_base._M_offset == 0 &&
        states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p ==
        states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
        .super__Bit_iterator_base._M_p) {
      __assert_fail("not states.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                    ,0x1228,
                    "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(json_sax_t *) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
  }
  else {
    tVar5 = get_token(this);
    if (tVar5 == value_separator) goto LAB_001234af;
    if (this->last_token != end_array) {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_e0,&this->m_lexer);
      sVar3 = (this->m_lexer).chars_read;
      exception_message(&local_100,this,end_array);
      parse_error::create(&local_c0,0x65,sVar3,&local_100);
      iVar6 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_e0,&local_c0);
      uVar7 = (undefined1)iVar6;
      goto LAB_00123665;
    }
    iVar6 = (*sax->_vptr_json_sax[10])(sax);
    if ((char)iVar6 == '\0') goto LAB_00123685;
    if (states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
        .super__Bit_iterator_base._M_offset == 0 &&
        states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p ==
        states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
        .super__Bit_iterator_base._M_p) {
      __assert_fail("not states.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                    ,0x11ef,
                    "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(json_sax_t *) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
  }
  bVar8 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset == 0;
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset =
       states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_offset - 1;
  if (bVar8) {
    states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0x3f;
    states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p + -1;
  }
  goto LAB_00123370;
code_r0x001234f8:
  std::vector<bool,_std::allocator<bool>_>::push_back(&states,false);
  get_token(this);
  goto LAB_00123257;
}

Assistant:

bool sax_parse_internal(json_sax_t* sax)
    {
        // stack to remember the hieararchy of structured values we are parsing
        // true = array; false = object
        std::vector<bool> states;
        // value to avoid a goto (see comment where set to true)
        bool skip_to_state_evaluation = false;

        while (true)
        {
            if (not skip_to_state_evaluation)
            {
                // invariant: get_token() was called before each iteration
                switch (last_token)
                {
                    case token_type::begin_object:
                    {
                        if (JSON_UNLIKELY(not sax->start_object()))
                        {
                            return false;
                        }

                        // closing } -> we are done
                        if (get_token() == token_type::end_object)
                        {
                            if (JSON_UNLIKELY(not sax->end_object()))
                            {
                                return false;
                            }
                            break;
                        }

                        // parse key
                        if (JSON_UNLIKELY(last_token != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::value_string)));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->key(m_lexer.get_string())))
                            {
                                return false;
                            }
                        }

                        // parse separator (:)
                        if (JSON_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::name_separator)));
                        }

                        // remember we are now inside an object
                        states.push_back(false);

                        // parse values
                        get_token();
                        continue;
                    }

                    case token_type::begin_array:
                    {
                        if (JSON_UNLIKELY(not sax->start_array()))
                        {
                            return false;
                        }

                        // closing ] -> we are done
                        if (get_token() == token_type::end_array)
                        {
                            if (JSON_UNLIKELY(not sax->end_array()))
                            {
                                return false;
                            }
                            break;
                        }

                        // remember we are now inside an array
                        states.push_back(true);

                        // parse values (no need to call get_token)
                        continue;
                    }

                    case token_type::value_float:
                    {
                        const auto res = m_lexer.get_number_float();

                        if (JSON_UNLIKELY(not std::isfinite(res)))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    out_of_range::create(406, "number overflow parsing '" + m_lexer.get_token_string() + "'"));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->number_float(res, m_lexer.get_string())))
                            {
                                return false;
                            }
                            break;
                        }
                    }

                    case token_type::literal_false:
                    {
                        if (JSON_UNLIKELY(not sax->boolean(false)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_null:
                    {
                        if (JSON_UNLIKELY(not sax->null()))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_true:
                    {
                        if (JSON_UNLIKELY(not sax->boolean(true)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_integer:
                    {
                        if (JSON_UNLIKELY(not sax->number_integer(m_lexer.get_number_integer())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_string:
                    {
                        if (JSON_UNLIKELY(not sax->string(m_lexer.get_string())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_unsigned:
                    {
                        if (JSON_UNLIKELY(not sax->number_unsigned(m_lexer.get_number_unsigned())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::parse_error:
                    {
                        // using "uninitialized" to avoid "expected" message
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::uninitialized)));
                    }

                    default: // the last token was unexpected
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::literal_or_value)));
                    }
                }
            }
            else
            {
                skip_to_state_evaluation = false;
            }

            // we reached this line after we successfully parsed a value
            if (states.empty())
            {
                // empty stack: we reached the end of the hieararchy: done
                return true;
            }
            else
            {
                if (states.back())  // array
                {
                    // comma -> next value
                    if (get_token() == token_type::value_separator)
                    {
                        // parse a new value
                        get_token();
                        continue;
                    }

                    // closing ]
                    if (JSON_LIKELY(last_token == token_type::end_array))
                    {
                        if (JSON_UNLIKELY(not sax->end_array()))
                        {
                            return false;
                        }

                        // We are done with this array. Before we can parse a
                        // new value, we need to evaluate the new state first.
                        // By setting skip_to_state_evaluation to false, we
                        // are effectively jumping to the beginning of this if.
                        assert(not states.empty());
                        states.pop_back();
                        skip_to_state_evaluation = true;
                        continue;
                    }
                    else
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_array)));
                    }
                }
                else  // object
                {
                    // comma -> next value
                    if (get_token() == token_type::value_separator)
                    {
                        // parse key
                        if (JSON_UNLIKELY(get_token() != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::value_string)));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->key(m_lexer.get_string())))
                            {
                                return false;
                            }
                        }

                        // parse separator (:)
                        if (JSON_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::name_separator)));
                        }

                        // parse values
                        get_token();
                        continue;
                    }

                    // closing }
                    if (JSON_LIKELY(last_token == token_type::end_object))
                    {
                        if (JSON_UNLIKELY(not sax->end_object()))
                        {
                            return false;
                        }

                        // We are done with this object. Before we can parse a
                        // new value, we need to evaluate the new state first.
                        // By setting skip_to_state_evaluation to false, we
                        // are effectively jumping to the beginning of this if.
                        assert(not states.empty());
                        states.pop_back();
                        skip_to_state_evaluation = true;
                        continue;
                    }
                    else
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_object)));
                    }
                }
            }
        }
    }